

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfsx11integration.cpp
# Opt level: O0

QSize __thiscall QEglFSX11Integration::screenSize(QEglFSX11Integration *this)

{
  bool bVar1;
  undefined4 uVar2;
  int iVar3;
  qsizetype qVar4;
  const_reference pQVar5;
  QSize *in_RDI;
  long in_FS_OFFSET;
  XWindowAttributes a;
  QList<QByteArray> env;
  qsizetype in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  QSize local_d8;
  undefined1 local_d0 [136];
  QSize local_48;
  char local_40 [24];
  QList<QByteArray> local_28;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QSize::isEmpty(in_RDI);
  if (bVar1) {
    local_28.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_28.d.ptr = (QByteArray *)0xaaaaaaaaaaaaaaaa;
    local_28.d.size = -0x5555555555555556;
    qgetenv(local_40);
    QByteArray::split((char)&local_28);
    QByteArray::~QByteArray((QByteArray *)0x103c35);
    qVar4 = QList<QByteArray>::size(&local_28);
    if (qVar4 == 2) {
      pQVar5 = QList<QByteArray>::at
                         ((QList<QByteArray> *)
                          CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          in_stack_ffffffffffffff08);
      uVar2 = QByteArray::toInt((bool *)pQVar5,0);
      pQVar5 = QList<QByteArray>::at
                         ((QList<QByteArray> *)CONCAT44(uVar2,in_stack_ffffffffffffff10),
                          in_stack_ffffffffffffff08);
      QByteArray::toInt((bool *)pQVar5,0);
      QSize::QSize((QSize *)CONCAT44(uVar2,in_stack_ffffffffffffff10),
                   (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),(int)in_stack_ffffffffffffff08);
      in_RDI[10] = local_48;
    }
    else {
      memset(local_d0,0xaa,0x88);
      iVar3 = XGetWindowAttributes
                        (in_RDI[1],
                         *(undefined8 *)
                          (*(long *)((long)in_RDI[1] + 0xe8) +
                           (long)*(int *)((long)in_RDI[1] + 0xe0) * 0x80 + 0x10),local_d0);
      if (iVar3 != 0) {
        QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),(int)in_stack_ffffffffffffff08)
        ;
        in_RDI[10] = local_d8;
      }
    }
    QList<QByteArray>::~QList((QList<QByteArray> *)0x103d33);
  }
  local_10 = in_RDI[10];
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QSize QEglFSX11Integration::screenSize() const
{
    if (m_screenSize.isEmpty()) {
        QList<QByteArray> env = qgetenv("EGLFS_X11_SIZE").split('x');
        if (env.size() == 2) {
            m_screenSize = QSize(env.at(0).toInt(), env.at(1).toInt());
        } else {
            XWindowAttributes a;
            if (XGetWindowAttributes(DISPLAY, DefaultRootWindow(DISPLAY), &a))
                m_screenSize = QSize(a.width, a.height);
        }
    }
    return m_screenSize;
}